

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

double __thiscall doctest::detail::MessageBuilder::log(MessageBuilder *this,double __x)

{
  int *piVar1;
  char *p;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  IReporter **curr_rep;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  if (this->logged == false) {
    tlssPop();
    if (&local_38 == (anon_union_24_2_13149d16_for_String_2 *)this) {
      if ((local_38.buf[0x17] < '\0') && (local_38.data.ptr != (char *)0x0)) {
        operator_delete__(local_38.data.ptr);
      }
    }
    else {
      if (((this->super_MessageData).m_string.field_0.buf[0x17] < '\0') &&
         (p = (this->super_MessageData).m_string.field_0.data.ptr, p != (char *)0x0)) {
        operator_delete__(p);
      }
      *(ulong *)((long)&(this->super_MessageData).m_string.field_0 + 0x10) =
           CONCAT17(local_38.buf[0x17],local_38._16_7_);
      (this->super_MessageData).m_string.field_0.data.ptr = local_38.data.ptr;
      *(undefined8 *)((long)&(this->super_MessageData).m_string.field_0 + 8) = local_38._8_8_;
    }
    this->logged = true;
  }
  puVar2 = *(undefined8 **)(g_cs + 0x10d8);
  for (puVar5 = *(undefined8 **)(g_cs + 0x10d0); puVar5 != puVar2; puVar5 = puVar5 + 1) {
    (**(code **)(*(long *)*puVar5 + 0x50))((long *)*puVar5,this);
  }
  if (((this->super_MessageData).m_severity & is_warn) == 0) {
    lVar3 = g_cs + 0xb8;
    if (*(char *)(in_FS_OFFSET + -0x1880) == '\0') {
      LOCK();
      UNLOCK();
      uVar4 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
      MultiLaneAtomic<int>::myAtomic()::laneCounter =
           MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
      *(ulong *)(in_FS_OFFSET + -0x1888) = uVar4;
      *(undefined1 *)(in_FS_OFFSET + -0x1880) = 1;
    }
    else {
      uVar4 = *(ulong *)(in_FS_OFFSET + -0x1888);
    }
    LOCK();
    piVar1 = (int *)(lVar3 + uVar4 * 0x40);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (((this->super_MessageData).m_severity & is_warn) == 0) {
      lVar3 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -0x1880) == '\0') {
        LOCK();
        UNLOCK();
        uVar4 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(in_FS_OFFSET + -0x1888) = uVar4;
        *(undefined1 *)(in_FS_OFFSET + -0x1880) = 1;
      }
      else {
        uVar4 = *(ulong *)(in_FS_OFFSET + -0x1888);
      }
      LOCK();
      piVar1 = (int *)(lVar3 + uVar4 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  isDebuggerActive();
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

bool MessageBuilder::log() {
        if (!logged) {
            m_string = tlssPop();
            logged = true;
        }
        
        DOCTEST_ITERATE_THROUGH_REPORTERS(log_message, *this);

        const bool isWarn = m_severity & assertType::is_warn;

        // warn is just a message in this context so we don't treat it as an assert
        if(!isWarn) {
            addAssert(m_severity);
            addFailedAssert(m_severity);
        }

        return isDebuggerActive() && !getContextOptions()->no_breaks && !isWarn &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }